

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Quat4f.cpp
# Opt level: O2

Quat4f __thiscall Quat4f::randomRotation(Quat4f *this,float u0,float u1,float u2)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  float fVar7;
  Quat4f QVar8;
  
  fVar7 = 1.0 - u0 * u0;
  if (fVar7 < 0.0) {
    fVar7 = sqrtf(fVar7);
  }
  else {
    fVar7 = SQRT(fVar7);
  }
  dVar1 = (double)(u2 * 3.1415927);
  dVar2 = cos(dVar1);
  dVar3 = sin(dVar1);
  dVar4 = cos((double)(u1 * 6.2831855));
  dVar5 = sin(dVar1);
  dVar6 = sin((double)(u1 * 6.2831855));
  dVar1 = sin(dVar1);
  QVar8.m_elements[0] = (float)dVar2;
  QVar8.m_elements[1] = (float)(dVar4 * dVar3 * (double)fVar7);
  QVar8.m_elements[2] = (float)(dVar6 * dVar5 * (double)fVar7);
  QVar8.m_elements[3] = (float)(dVar1 * (double)u0);
  this->m_elements[0] = QVar8.m_elements[0];
  this->m_elements[1] = QVar8.m_elements[1];
  this->m_elements[2] = QVar8.m_elements[2];
  this->m_elements[3] = QVar8.m_elements[3];
  return (Quat4f)QVar8.m_elements;
}

Assistant:

Quat4f Quat4f::randomRotation( float u0, float u1, float u2 )
{
	float z = u0;
	float theta = static_cast< float >( 2.f * M_PI * u1 );
	float r = sqrt( 1.f - z * z );
	float w = static_cast< float >( M_PI * u2 );

	return Quat4f
	(
		cos( w ),
		sin( w ) * cos( theta ) * r,
		sin( w ) * sin( theta ) * r,
		sin( w ) * z
	);
}